

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_json_purify_len(char *string)

{
  byte bVar1;
  int iVar2;
  char *p;
  int iVar3;
  
  iVar2 = 0;
  do {
    bVar1 = *string;
    if ((bVar1 - 9 < 2) || (bVar1 == 0xd)) {
      iVar3 = 2;
    }
    else {
      iVar3 = 6;
      if ((bVar1 != 0x22) && (bVar1 != 0x5c)) {
        if (bVar1 == 0) {
          return iVar2;
        }
        iVar3 = (uint)((char)bVar1 < ' ') * 5 + 1;
      }
    }
    iVar2 = iVar2 + iVar3;
    string = (char *)((byte *)string + 1);
  } while( true );
}

Assistant:

int
lws_json_purify_len(const char *string)
{
	int len = 0;
	const char *p = string;

	while (*p) {
		if (*p == '\t' || *p == '\n' || *p == '\r') {
			p++;
			len += 2;
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			len += 6;
			p++;
			continue;
		}
		p++;
		len++;
	}

	return len;
}